

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O3

bool __thiscall
S2Builder::EdgeChainSimplifier::TargetInputVertices
          (EdgeChainSimplifier *this,VertexId v,S2PolylineSimplifier *simplifier)

{
  uint uVar1;
  pointer pcVar2;
  bool bVar3;
  long lVar4;
  anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *paVar5;
  bool bVar6;
  
  pcVar2 = (this->site_vertices_->
           super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pcVar2[v].super_compact_array_base<int,_std::allocator<int>_>.is_inlined_ == false) {
    paVar5 = (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *)
             pcVar2[v].super_compact_array_base<int,_std::allocator<int>_>.field_7.pointer_;
  }
  else {
    paVar5 = &pcVar2[v].super_compact_array_base<int,_std::allocator<int>_>.field_7;
  }
  uVar1 = *(uint *)&pcVar2[v].super_compact_array_base<int,_std::allocator<int>_>;
  if ((uVar1 & 0xffffff) == 0) {
    bVar3 = true;
  }
  else {
    lVar4 = 0;
    do {
      bVar3 = S2PolylineSimplifier::TargetDisc
                        (simplifier,
                         (this->builder_->input_vertices_).
                         super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                         _M_impl.super__Vector_impl_data._M_start + *(int *)((long)paVar5 + lVar4),
                         (S1ChordAngle)(this->builder_->edge_snap_radius_ca_).length2_);
      if (!bVar3) {
        return bVar3;
      }
      bVar6 = ((ulong)uVar1 & 0xffffff) * 4 + -4 != lVar4;
      lVar4 = lVar4 + 4;
    } while (bVar6);
  }
  return bVar3;
}

Assistant:

bool S2Builder::EdgeChainSimplifier::TargetInputVertices(
    VertexId v, S2PolylineSimplifier* simplifier) const {
  for (InputVertexId i : site_vertices_[v]) {
    if (!simplifier->TargetDisc(builder_.input_vertices_[i],
                                builder_.edge_snap_radius_ca_)) {
      return false;
    }
  }
  return true;
}